

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

RepeatedField<int> * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRaw<google::protobuf::RepeatedField<int>>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 offset;
  OneofDescriptor *pOVar2;
  RepeatedField<int> *pRVar3;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pOVar2 = FieldDescriptor::containing_oneof(field);
  if ((pOVar2 != (OneofDescriptor *)0x0) && (bVar1 = HasOneofField(this,message,field), !bVar1)) {
    pRVar3 = DefaultRaw<google::protobuf::RepeatedField<int>>(this,field);
    return pRVar3;
  }
  offset = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  pRVar3 = (anonymous_namespace)::GetConstRefAtOffset<google::protobuf::RepeatedField<int>>
                     (message,offset);
  return pRVar3;
}

Assistant:

const Type& GeneratedMessageReflection::GetRaw(
    const Message& message, const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}